

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.h
# Opt level: O0

array<int,_allocator_default<int>_> *
allocator_default<array<int,_allocator_default<int>_>_>::alloc_array(int size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  array<int,_allocator_default<int>_> *paVar5;
  int in_EDI;
  ulong uVar6;
  array<int,_allocator_default<int>_> *local_40;
  
  uVar2 = (ulong)in_EDI;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x10),0);
  uVar6 = uVar3 + 8;
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar3) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar4 = (ulong *)operator_new__(uVar6);
  *puVar4 = uVar2;
  paVar5 = (array<int,_allocator_default<int>_> *)(puVar4 + 1);
  if (uVar2 != 0) {
    local_40 = paVar5;
    do {
      array<int,_allocator_default<int>_>::array((array<int,_allocator_default<int>_> *)0x1e9581);
      local_40 = local_40 + 1;
    } while (local_40 != paVar5 + uVar2);
  }
  return paVar5;
}

Assistant:

static T *alloc_array(int size) { return new T [size]; }